

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTerminatorSymbol,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcTerminatorSymbol *in;
  
  in = (IfcTerminatorSymbol *)operator_new(0xc0);
  *(undefined ***)&in->field_0xa8 = &PTR__Object_008d12a0;
  *(undefined8 *)&in->field_0xb0 = 0;
  *(char **)&in->field_0xb8 = "IfcTerminatorSymbol";
  Assimp::IFC::Schema_2x3::IfcAnnotationSymbolOccurrence::IfcAnnotationSymbolOccurrence
            ((IfcAnnotationSymbolOccurrence *)in,&PTR_construction_vtable_24__00947a60);
  *(undefined8 *)&(in->super_IfcAnnotationSymbolOccurrence).field_0x98 = 0;
  *(undefined8 *)&(in->super_IfcAnnotationSymbolOccurrence).field_0xa0 = 0;
  *(undefined ***)
   &(in->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem =
       &PTR__IfcTerminatorSymbol_00947980;
  *(undefined ***)&in->field_0xa8 = &PTR__IfcTerminatorSymbol_00947a48;
  (in->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcTerminatorSymbol_009479a8;
  *(undefined ***)
   &(in->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x70 = &PTR__IfcTerminatorSymbol_009479d0;
  *(undefined ***)
   &(in->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x80 = &PTR__IfcTerminatorSymbol_009479f8;
  *(undefined ***)
   &(in->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.field_0x90 =
       &PTR__IfcTerminatorSymbol_00947a20;
  GenericFill<Assimp::IFC::Schema_2x3::IfcTerminatorSymbol>(db,params,in);
  return (Object *)
         (&(in->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
           super_IfcStyledItem.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence
                             .super_IfcStyledItem + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }